

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Solver::countLevels(Solver *this,Literal *first,Literal *last,uint32 maxLevel)

{
  bool bVar1;
  uint32 uVar2;
  uint32 n_00;
  Solver *this_00;
  reference puVar3;
  uint in_ECX;
  Literal *in_RDX;
  Literal *in_RSI;
  long in_RDI;
  uint32 *levEpoch;
  uint32 epoch;
  uint32 n;
  Var in_stack_ffffffffffffffac;
  bool local_41;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint local_28;
  Literal *local_18;
  uint local_4;
  
  if (in_ECX < 2) {
    local_41 = in_ECX != 0 && in_RSI != in_RDX;
    local_4 = (uint)local_41;
  }
  else {
    if ((*(long *)(in_RDI + 0x80) != 0) &&
       (bVar1 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::empty
                          (*(pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> **)
                            (in_RDI + 0x80)), !bVar1)) {
      Potassco::fail(-1,
                     "uint32 Clasp::Solver::countLevels(const Literal *, const Literal *, uint32)",
                     0x714,"!ccMin_ || ccMin_->todo.empty()",
                     "Must not be called during minimization!",0);
    }
    local_28 = 0;
    sizeVec<Clasp::Solver::DecisionLevels>((DecisionLevels *)0x1f05ce);
    uVar2 = incEpoch((Solver *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (uint32)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                     (uint32)in_stack_ffffffffffffffc8);
    for (local_18 = in_RSI; local_18 != in_RDX; local_18 = local_18 + 1) {
      this_00 = (Solver *)(in_RDI + 0x1c0);
      Literal::var(local_18);
      n_00 = level(this_00,in_stack_ffffffffffffffac);
      puVar3 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,n_00);
      if (*puVar3 != uVar2) {
        *puVar3 = uVar2;
        local_28 = local_28 + 1;
        if (local_28 == in_ECX) break;
      }
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

uint32 Solver::countLevels(const Literal* first, const Literal* last, uint32 maxLevel) {
	if (maxLevel < 2) { return uint32(maxLevel && first != last); }
	POTASSCO_ASSERT(!ccMin_ || ccMin_->todo.empty(), "Must not be called during minimization!");
	uint32 n = 0;
	for (uint32 epoch = incEpoch(sizeVec(levels_) + 1); first != last; ++first) {
		assert(value(first->var()) != value_free);
		uint32& levEpoch = epoch_[level(first->var())];
		if (levEpoch != epoch) {
			levEpoch = epoch;
			if (++n == maxLevel) { break; }
		}
	}
	return n;
}